

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * calculateFiller(QString *__return_storage_ptr__,qsizetype padding,char32_t fillChar,
                         qsizetype fieldWidth,QLocaleData *localeData)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  uint uVar4;
  char32_t cVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_38;
  undefined4 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (fillChar == L'0') {
    localeString(&local_38,(QLocaleData *)fieldWidth,ZeroDigit,
                 (DataRange)
                 ((ulong)*(byte *)(fieldWidth + 0x58) << 0x20 |
                 (ulong)*(ushort *)(fieldWidth + 0x16)));
  }
  else {
    uVar4 = 0;
    cVar5 = fillChar;
    if (0xffff < (uint)fillChar) {
      cVar5 = ((uint)fillChar >> 10) + L'ퟀ';
      uVar4 = (fillChar & 0x3ffU) << 0x10 | 0xdc000000;
    }
    local_1c._2_2_ = (short)(uVar4 >> 0x10);
    bVar6 = local_1c._2_2_ == 0;
    local_1c = cVar5 & 0xffffU | uVar4;
    QString::QString(&local_38,(QChar *)&local_1c,2 - (ulong)bVar6);
  }
  pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = local_38.d.d;
  (__return_storage_ptr__->d).ptr = local_38.d.ptr;
  qVar3 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_38.d.size;
  local_38.d.d = (Data *)pQVar1;
  local_38.d.ptr = pcVar2;
  local_38.d.size = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  if (1 < padding) {
    QString::repeated(&local_38,__return_storage_ptr__,padding);
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_38.d.d;
    (__return_storage_ptr__->d).ptr = local_38.d.ptr;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.d = (Data *)pQVar1;
    local_38.d.ptr = pcVar2;
    local_38.d.size = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString calculateFiller(qsizetype padding,
                               char32_t fillChar,
                               [[maybe_unused]] qsizetype fieldWidth,
                               const QLocaleData *localeData)
{
    QString filler;
    if (fillChar == U'0') {
        Q_ASSERT(fieldWidth < 0);
        filler = localeData->zeroDigit();
    } else {
        filler = QString(QChar::fromUcs4(fillChar));
    }
    // ### size is not width
    if (padding > 1)
        filler = filler.repeated(padding);
    return filler;
}